

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O0

void __thiscall booster::fork_shared_mutex::fork_shared_mutex(fork_shared_mutex *this)

{
  data *pdVar1;
  pthread_rwlock_t *ppVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  noncopyable *in_RDI;
  int err;
  char *pcVar6;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar7;
  int iVar8;
  
  noncopyable::noncopyable(in_RDI);
  pdVar1 = (data *)operator_new(0x40);
  hold_ptr<booster::fork_shared_mutex::data>::hold_ptr
            ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI,pdVar1);
  ppVar2 = (pthread_rwlock_t *)
           hold_ptr<booster::fork_shared_mutex::data>::operator->
                     ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
  pthread_rwlock_init(ppVar2,(pthread_rwlockattr_t *)0x0);
  pFVar3 = tmpfile();
  pdVar1 = hold_ptr<booster::fork_shared_mutex::data>::operator->
                     ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
  pdVar1->lock_file = (FILE *)pFVar3;
  pdVar1 = hold_ptr<booster::fork_shared_mutex::data>::operator->
                     ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
  if (pdVar1->lock_file == (FILE *)0x0) {
    piVar4 = __errno_location();
    iVar7 = *piVar4;
    ppVar2 = (pthread_rwlock_t *)
             hold_ptr<booster::fork_shared_mutex::data>::operator->
                       ((hold_ptr<booster::fork_shared_mutex::data> *)in_RDI);
    pthread_rwlock_destroy(ppVar2);
    iVar8 = (int)((ulong)ppVar2 >> 0x20);
    pcVar5 = (char *)__cxa_allocate_exception(0x40);
    pcVar6 = pcVar5;
    std::_V2::system_category();
    system::system_error::system_error
              ((system_error *)pdVar1,iVar8,
               (error_category *)CONCAT44(iVar7,in_stack_ffffffffffffffa0),pcVar6);
    __cxa_throw(pcVar5,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  return;
}

Assistant:

fork_shared_mutex::fork_shared_mutex() : d(new data)
	{
		pthread_rwlock_init(&d->lock,0);
		d->lock_file = tmpfile();
		if(!d->lock_file) {
			int err=errno;
			pthread_rwlock_destroy(&d->lock);
			throw system::system_error(err,system::system_category(),"fork_shared_mutex:failed to create temporary file");
		}
	}